

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_b44.c
# Opt level: O1

exr_result_t
uncompress_b44_impl(exr_decode_pipeline_t *decode,void *compressed_data,uint64_t comp_buf_size,
                   void *uncompressed_data,uint64_t uncomp_buf_size)

{
  byte bVar1;
  exr_coding_channel_info_t *peVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  ushort uVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  size_t sVar14;
  ulong uVar15;
  long lVar16;
  ushort *__src;
  void *pvVar17;
  void *pvVar18;
  exr_decode_pipeline_t *peVar19;
  uint uVar20;
  exr_coding_channel_info_t *peVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  long lVar25;
  int iVar26;
  int iVar27;
  int iVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  undefined1 auVar28 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar50;
  undefined1 auVar51 [16];
  int iVar52;
  int iVar53;
  uint16_t s [16];
  ushort local_108 [20];
  ulong local_e0;
  void *local_d8;
  void *local_d0;
  void *local_c8;
  void *local_c0;
  ulong local_b8;
  long local_b0;
  ulong local_a8;
  size_t local_a0;
  exr_decode_pipeline_t *local_98;
  void *local_90;
  exr_coding_channel_info_t *local_88;
  void *local_80;
  int local_78;
  int iStack_74;
  int iStack_70;
  int iStack_6c;
  int local_68;
  int iStack_64;
  int iStack_60;
  int iStack_5c;
  uint64_t local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  local_e0 = comp_buf_size;
  local_98 = decode;
  local_90 = uncompressed_data;
  local_58 = uncomp_buf_size;
  if (0 < decode->channel_count) {
    local_c0 = decode->scratch_buffer_1;
    iVar26 = -0x7ffffff1;
    iVar29 = -0x80000000;
    iVar30 = -0x7ffffff1;
    iVar32 = -0x80000000;
    lVar24 = 0;
    local_68 = -0x7ffffff1;
    iStack_64 = -0x7ffffff1;
    iStack_60 = -0x7ffffff1;
    iStack_5c = -0x7ffffff1;
    local_78 = -0x80000000;
    iStack_74 = -0x80000000;
    iStack_70 = -0x80000000;
    iStack_6c = -0x80000000;
    uVar13 = 0;
    auVar46 = _DAT_0012c090;
    auVar47 = _DAT_0012c0a0;
    auVar38 = _DAT_0012c0b0;
    auVar48 = _DAT_0012c0c0;
    auVar51 = _DAT_0012c0e0;
    iVar49 = iVar26;
    iVar50 = iVar30;
    iVar52 = iVar29;
    iVar53 = iVar32;
    do {
      pvVar18 = local_c0;
      peVar2 = local_98->channels;
      uVar20 = peVar2[lVar24].width;
      local_d8 = (void *)(long)(int)uVar20;
      local_b8 = (ulong)peVar2[lVar24].height;
      sVar14 = (long)peVar2[lVar24].bytes_per_element * local_b8 * (long)local_d8;
      uVar10 = 0;
      uVar15 = uVar13;
      local_a0 = sVar14;
      if (sVar14 != 0) {
        peVar21 = peVar2 + lVar24;
        if (peVar21->data_type == 1) {
          uVar10 = 5;
          if (0 < peVar2[lVar24].height) {
            bVar4 = 0 < (int)uVar20;
            local_40 = (ulong)uVar20;
            uVar15 = 0;
            local_b0 = lVar24;
            local_88 = peVar21;
            do {
              uVar10 = 8;
              bVar3 = bVar4;
              if (0 < (int)local_d8) {
                uVar12 = uVar13 + 3;
                if (local_e0 < uVar12) {
                  uVar10 = 1;
                }
                else {
                  local_38 = uVar15 | 3;
                  local_48 = uVar15 | 1;
                  local_50 = uVar15 | 2;
                  pvVar18 = (void *)((long)local_c0 + uVar15 * (long)local_d8 * 2);
                  local_d0 = (void *)((long)pvVar18 + (long)local_d8 * 2);
                  local_c8 = (void *)((long)local_d0 + (long)local_d8 * 2);
                  local_80 = (void *)((long)local_c8 + (long)local_d8 * 2);
                  uVar23 = 0;
                  uVar22 = uVar13;
                  local_a8 = uVar15;
                  do {
                    bVar1 = (byte)*(ushort *)((long)compressed_data + 2);
                    if (bVar1 < 0x34) {
                      uVar13 = uVar22 + 0xe;
                      if (local_e0 < uVar13) break;
                      local_108[0] = *compressed_data << 8 | *compressed_data >> 8;
                      bVar5 = bVar1 >> 2;
                      sVar9 = (short)(-0x20 << (bVar5 & 0x1f));
                      sVar8 = local_108[0] + sVar9;
                      local_108[4] = (short)(((bVar1 & 3) << 4 |
                                             (uint)(*(byte *)((long)compressed_data + 3) >> 4)) <<
                                            (bVar5 & 0x1f)) + sVar8;
                      iVar49 = (uint)(byte)((byte)*(ushort *)((long)compressed_data + 4) >> 6) +
                               (*(byte *)((long)compressed_data + 3) & 0xf) * 4;
                      sVar7 = local_108[4] + sVar9;
                      local_108[8] = (short)(iVar49 << (bVar5 & 0x1f)) + sVar7;
                      local_108[0xc] =
                           (short)(((byte)*(ushort *)((long)compressed_data + 4) & 0x3f) + iVar49 +
                                   -0x20 << (bVar5 & 0x1f)) + sVar7;
                      local_108[1] = ((ushort)(*(byte *)((long)compressed_data + 5) >> 2) <<
                                     (bVar5 & 0x1f)) + sVar8;
                      local_108[5] = (short)(((*(byte *)((long)compressed_data + 5) & 3) << 4 |
                                             (uint)(byte)((byte)*(ushort *)
                                                                 ((long)compressed_data + 6) >> 4))
                                            << (bVar5 & 0x1f)) + sVar7;
                      local_108[9] = (short)((uint)(*(byte *)((long)compressed_data + 7) >> 6) +
                                             ((byte)*(ushort *)((long)compressed_data + 6) & 0xf) *
                                             4 << (bVar5 & 0x1f)) + sVar9 + local_108[8];
                      local_108[0xd] =
                           (short)((*(byte *)((long)compressed_data + 7) & 0x3f) << (bVar5 & 0x1f))
                           + sVar9 + local_108[0xc];
                      local_108[2] = ((ushort)(byte)((byte)*(ushort *)((long)compressed_data + 8) >>
                                                    2) << (bVar5 & 0x1f)) + sVar9 + local_108[1];
                      local_108[6] = (short)((((byte)*(ushort *)((long)compressed_data + 8) & 3) <<
                                              4 | (uint)(*(byte *)((long)compressed_data + 9) >> 4))
                                            << (bVar5 & 0x1f)) + sVar9 + local_108[5];
                      local_108[10] =
                           (short)((uint)(byte)((byte)*(ushort *)((long)compressed_data + 10) >> 6)
                                   + (*(byte *)((long)compressed_data + 9) & 0xf) * 4 <<
                                  (bVar5 & 0x1f)) + sVar9 + local_108[9];
                      local_108[0xe] =
                           (short)(((byte)*(ushort *)((long)compressed_data + 10) & 0x3f) <<
                                  (bVar5 & 0x1f)) + sVar9 + local_108[0xd];
                      local_108[3] = ((ushort)(*(byte *)((long)compressed_data + 0xb) >> 2) <<
                                     (bVar5 & 0x1f)) + sVar9 + local_108[2];
                      local_108[7] = (short)(((*(byte *)((long)compressed_data + 0xb) & 3) << 4 |
                                             (uint)(byte)((byte)*(ushort *)
                                                                 ((long)compressed_data + 0xc) >> 4)
                                             ) << (bVar5 & 0x1f)) + sVar9 + local_108[6];
                      local_108[0xb] =
                           (short)((uint)(*(byte *)((long)compressed_data + 0xd) >> 6) +
                                   ((byte)*(ushort *)((long)compressed_data + 0xc) & 0xf) * 4 <<
                                  (bVar5 & 0x1f)) + sVar9 + local_108[10];
                      local_108[0xf] =
                           (short)((*(byte *)((long)compressed_data + 0xd) & 0x3f) << (bVar5 & 0x1f)
                                  ) + sVar9 + local_108[0xe];
                      lVar24 = 0;
                      auVar46._8_4_ = 0xffffffff;
                      auVar46._0_8_ = 0xffffffffffffffff;
                      auVar46._12_4_ = 0xffffffff;
                      do {
                        auVar47 = *(undefined1 (*) [16])(local_108 + lVar24);
                        auVar38._0_2_ = -(ushort)(auVar47._0_2_ < 0);
                        auVar38._2_2_ = -(ushort)(auVar47._2_2_ < 0);
                        auVar38._4_2_ = -(ushort)(auVar47._4_2_ < 0);
                        auVar38._6_2_ = -(ushort)(auVar47._6_2_ < 0);
                        auVar38._8_2_ = -(ushort)(auVar47._8_2_ < 0);
                        auVar38._10_2_ = -(ushort)(auVar47._10_2_ < 0);
                        auVar38._12_2_ = -(ushort)(auVar47._12_2_ < 0);
                        auVar38._14_2_ = -(ushort)(auVar47._14_2_ < 0);
                        *(undefined1 (*) [16])(local_108 + lVar24) =
                             (auVar38 | auVar47) ^ auVar46 | auVar47 & auVar38 & _DAT_0012c080;
                        lVar24 = lVar24 + 8;
                      } while (lVar24 != 0x10);
                      lVar24 = 0xe;
                    }
                    else {
                      uVar6 = (ushort)(byte)*compressed_data << 8;
                      local_108[0] = (ushort)*(byte *)((long)compressed_data + 1) | uVar6 & 0x7fff;
                      if (-1 < (short)uVar6) {
                        local_108[0] = ~CONCAT11((byte)*compressed_data,
                                                 *(byte *)((long)compressed_data + 1));
                      }
                      lVar24 = 0;
                      do {
                        auVar28._8_4_ = (int)lVar24;
                        auVar28._0_8_ = lVar24;
                        auVar28._12_4_ = (int)((ulong)lVar24 >> 0x20);
                        auVar33 = (auVar28 | auVar48) ^ auVar51;
                        iVar27 = auVar33._0_4_;
                        iVar31 = auVar33._8_4_;
                        auVar39._4_4_ = iVar27;
                        auVar39._0_4_ = iVar27;
                        auVar39._8_4_ = iVar31;
                        auVar39._12_4_ = iVar31;
                        auVar43._0_4_ = -(uint)(iVar27 < iVar26);
                        auVar43._4_4_ = -(uint)(iVar27 < iVar49);
                        auVar43._8_4_ = -(uint)(iVar31 < iVar30);
                        auVar43._12_4_ = -(uint)(iVar31 < iVar50);
                        auVar34._0_4_ = -(uint)(auVar33._4_4_ == iVar29);
                        auVar34._4_4_ = -(uint)(auVar33._4_4_ == iVar52);
                        auVar34._8_4_ = -(uint)(auVar33._12_4_ == iVar32);
                        auVar34._12_4_ = -(uint)(auVar33._12_4_ == iVar53);
                        auVar34 = auVar34 & auVar43;
                        auVar33 = pshuflw(auVar39,auVar34,0xe8);
                        auVar33 = packssdw(auVar33,auVar33);
                        if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          local_108[lVar24 + 1] = local_108[0];
                        }
                        auVar33 = packssdw(auVar34,auVar34);
                        auVar33 = packssdw(auVar33,auVar33);
                        if ((auVar33._0_4_ >> 0x10 & 1) != 0) {
                          local_108[lVar24 + 2] = local_108[0];
                        }
                        auVar33 = (auVar28 | auVar38) ^ auVar51;
                        iVar27 = auVar33._0_4_;
                        iVar31 = auVar33._8_4_;
                        auVar40._4_4_ = iVar27;
                        auVar40._0_4_ = iVar27;
                        auVar40._8_4_ = iVar31;
                        auVar40._12_4_ = iVar31;
                        auVar44._0_4_ = -(uint)(iVar27 < iVar26);
                        auVar44._4_4_ = -(uint)(iVar27 < iVar49);
                        auVar44._8_4_ = -(uint)(iVar31 < iVar30);
                        auVar44._12_4_ = -(uint)(iVar31 < iVar50);
                        auVar35._0_4_ = -(uint)(auVar33._4_4_ == iVar29);
                        auVar35._4_4_ = -(uint)(auVar33._4_4_ == iVar52);
                        auVar35._8_4_ = -(uint)(auVar33._12_4_ == iVar32);
                        auVar35._12_4_ = -(uint)(auVar33._12_4_ == iVar53);
                        auVar35 = auVar35 & auVar44;
                        auVar33 = packssdw(auVar40,auVar35);
                        auVar33 = packssdw(auVar33,auVar33);
                        if ((auVar33 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          local_108[lVar24 + 3] = local_108[0];
                        }
                        auVar33 = pshufhw(auVar35,auVar35,0x84);
                        auVar33 = packssdw(auVar33,auVar33);
                        if ((auVar33 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          local_108[lVar24 + 4] = local_108[0];
                        }
                        auVar33 = (auVar28 | auVar47) ^ auVar51;
                        iVar27 = auVar33._0_4_;
                        iVar31 = auVar33._8_4_;
                        auVar41._4_4_ = iVar27;
                        auVar41._0_4_ = iVar27;
                        auVar41._8_4_ = iVar31;
                        auVar41._12_4_ = iVar31;
                        auVar45._0_4_ = -(uint)(iVar27 < iVar26);
                        auVar45._4_4_ = -(uint)(iVar27 < iVar49);
                        auVar45._8_4_ = -(uint)(iVar31 < iVar30);
                        auVar45._12_4_ = -(uint)(iVar31 < iVar50);
                        auVar36._0_4_ = -(uint)(auVar33._4_4_ == iVar29);
                        auVar36._4_4_ = -(uint)(auVar33._4_4_ == iVar52);
                        auVar36._8_4_ = -(uint)(auVar33._12_4_ == iVar32);
                        auVar36._12_4_ = -(uint)(auVar33._12_4_ == iVar53);
                        auVar36 = auVar36 & auVar45;
                        auVar33 = pshuflw(auVar41,auVar36,0xe8);
                        auVar33 = packssdw(auVar33,auVar33);
                        if ((auVar33 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                          local_108[lVar24 + 5] = local_108[0];
                        }
                        auVar33 = packssdw(auVar36,auVar36);
                        auVar33 = packssdw(auVar33,auVar33);
                        if ((auVar33 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                          local_108[lVar24 + 6] = local_108[0];
                        }
                        auVar28 = (auVar28 | auVar46) ^ auVar51;
                        iVar27 = auVar28._0_4_;
                        iVar31 = auVar28._8_4_;
                        auVar37._4_4_ = iVar27;
                        auVar37._0_4_ = iVar27;
                        auVar37._8_4_ = iVar31;
                        auVar37._12_4_ = iVar31;
                        auVar42._0_4_ = -(uint)(iVar27 < iVar26);
                        auVar42._4_4_ = -(uint)(iVar27 < iVar49);
                        auVar42._8_4_ = -(uint)(iVar31 < iVar30);
                        auVar42._12_4_ = -(uint)(iVar31 < iVar50);
                        auVar33._0_4_ = -(uint)(auVar28._4_4_ == iVar29);
                        auVar33._4_4_ = -(uint)(auVar28._4_4_ == iVar52);
                        auVar33._8_4_ = -(uint)(auVar28._12_4_ == iVar32);
                        auVar33._12_4_ = -(uint)(auVar28._12_4_ == iVar53);
                        auVar33 = auVar33 & auVar42;
                        auVar28 = packssdw(auVar37,auVar33);
                        auVar28 = packssdw(auVar28,auVar28);
                        if ((auVar28 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                          local_108[lVar24 + 7] = local_108[0];
                        }
                        auVar28 = pshufhw(auVar33,auVar33,0x84);
                        auVar28 = packssdw(auVar28,auVar28);
                        if ((auVar28 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0)
                        {
                          local_108[lVar24 + 8] = local_108[0];
                        }
                        lVar24 = lVar24 + 8;
                      } while (lVar24 != 0x10);
                      lVar24 = 3;
                      uVar13 = uVar12;
                    }
                    if (peVar21->p_linear != '\0') {
                      lVar25 = 0;
                      do {
                        local_108[lVar25] = exrcore_logTable[local_108[lVar25]];
                        lVar25 = lVar25 + 1;
                      } while (lVar25 != 0x10);
                    }
                    sVar14 = (local_40 - uVar23) * 2;
                    if ((long)(uVar23 | 3) < (long)local_d8) {
                      sVar14 = 8;
                    }
                    memcpy(pvVar18,local_108,sVar14);
                    if (local_38 < local_b8) {
                      memcpy(local_d0,local_108 + 4,sVar14);
                      memcpy(local_c8,local_108 + 8,sVar14);
                      __src = local_108 + 0xc;
                      pvVar17 = local_80;
LAB_00106417:
                      memcpy(pvVar17,__src,sVar14);
                    }
                    else {
                      if (local_48 < local_b8) {
                        memcpy(local_d0,local_108 + 4,sVar14);
                      }
                      if (local_50 < local_b8) {
                        __src = local_108 + 8;
                        pvVar17 = local_c8;
                        goto LAB_00106417;
                      }
                    }
                    compressed_data = (void *)((long)compressed_data + lVar24);
                    uVar23 = uVar23 + 4;
                    bVar3 = (long)uVar23 < (long)local_d8;
                    peVar21 = local_88;
                    auVar46 = _DAT_0012c090;
                    auVar47 = _DAT_0012c0a0;
                    auVar38 = _DAT_0012c0b0;
                    auVar48 = _DAT_0012c0c0;
                    auVar51 = _DAT_0012c0e0;
                    iVar49 = iStack_64;
                    iVar50 = iStack_5c;
                    iVar26 = local_68;
                    iVar30 = iStack_60;
                    iVar52 = iStack_74;
                    iVar53 = iStack_6c;
                    iVar29 = local_78;
                    iVar32 = iStack_70;
                    if ((long)local_d8 <= (long)uVar23) {
                      uVar10 = 8;
                      uVar15 = local_a8;
                      lVar24 = local_b0;
                      goto LAB_00106513;
                    }
                    pvVar18 = (void *)((long)pvVar18 + 8);
                    local_d0 = (void *)((long)local_d0 + 8);
                    local_c8 = (void *)((long)local_c8 + 8);
                    local_80 = (void *)((long)local_80 + 8);
                    uVar12 = uVar13 + 3;
                    uVar22 = uVar13;
                  } while (uVar12 <= local_e0);
                  uVar13 = uVar22;
                  uVar10 = 1;
                  uVar15 = local_a8;
                  lVar24 = local_b0;
                }
              }
LAB_00106513:
            } while ((!bVar3) && (uVar15 = uVar15 + 4, uVar10 = 5, uVar15 < local_b8));
          }
          sVar14 = local_a0;
          if (uVar10 != 5) {
            sVar14 = 0;
          }
          if (uVar10 == 5) {
            uVar10 = 0;
          }
          local_c0 = (void *)((long)local_c0 + sVar14);
          uVar15 = uVar13;
        }
        else {
          uVar15 = sVar14 + uVar13;
          if (local_e0 < uVar15) {
            uVar10 = 1;
            uVar15 = uVar13;
          }
          else {
            memcpy(local_c0,compressed_data,sVar14);
            compressed_data = (void *)((long)compressed_data + sVar14);
            local_c0 = (void *)((long)pvVar18 + sVar14);
            auVar46 = _DAT_0012c090;
            auVar47 = _DAT_0012c0a0;
            auVar38 = _DAT_0012c0b0;
            auVar48 = _DAT_0012c0c0;
            auVar51 = _DAT_0012c0e0;
            iVar26 = local_68;
            iVar49 = iStack_64;
            iVar30 = iStack_60;
            iVar50 = iStack_5c;
            iVar29 = local_78;
            iVar52 = iStack_74;
            iVar32 = iStack_70;
            iVar53 = iStack_6c;
          }
        }
      }
      if ((uVar10 & 0xb) != 0) {
        return 1;
      }
      lVar24 = lVar24 + 1;
      uVar13 = uVar15;
    } while (lVar24 < local_98->channel_count);
  }
  iVar49 = (local_98->chunk).height;
  local_e0 = CONCAT71(local_e0._1_7_,0 < iVar49);
  if (0 < iVar49) {
    pvVar18 = (void *)0x0;
    uVar13 = 0;
    peVar19 = local_98;
    do {
      uVar20 = 0xe;
      if (0 < peVar19->channel_count) {
        local_c8 = (void *)CONCAT44(local_c8._4_4_,(peVar19->chunk).start_y + (int)pvVar18);
        local_d8 = peVar19->scratch_buffer_1;
        lVar25 = 0x19;
        lVar24 = 0;
        local_d0 = pvVar18;
        do {
          pvVar17 = local_90;
          peVar2 = peVar19->channels;
          sVar14 = (long)*(char *)((long)&peVar2->channel_name + lVar25) *
                   (long)*(int *)((long)peVar2 + lVar25 + -0xd);
          lVar16 = (long)*(int *)((long)peVar2 + lVar25 + -0x11) * sVar14;
          uVar20 = 0x10;
          if (lVar16 != 0) {
            uVar10 = *(uint *)((long)peVar2 + lVar25 + -5);
            uVar11 = (uint)pvVar18;
            if (1 < (int)uVar10) {
              if ((int)local_c8 % (int)uVar10 != 0) {
                local_d8 = (void *)((long)local_d8 + lVar16);
                goto LAB_001066ca;
              }
              uVar11 = (uint)(((ulong)pvVar18 & 0xffffffff) / (ulong)uVar10);
            }
            uVar20 = 1;
            if (sVar14 + uVar13 <= local_58) {
              memcpy(local_90,(void *)(uVar11 * sVar14 + (long)local_d8),sVar14);
              local_90 = (void *)((long)pvVar17 + sVar14);
              local_d8 = (void *)((long)local_d8 + lVar16);
              uVar20 = 0;
              uVar13 = sVar14 + uVar13;
              peVar19 = local_98;
              pvVar18 = local_d0;
            }
          }
LAB_001066ca:
          if ((uVar20 & 0xf) != 0) goto LAB_001066ea;
          lVar24 = lVar24 + 1;
          lVar25 = lVar25 + 0x30;
        } while (lVar24 < peVar19->channel_count);
        uVar20 = 0xe;
      }
LAB_001066ea:
      if ((uVar20 != 0xe) && (uVar20 != 0)) break;
      uVar20 = (int)pvVar18 + 1;
      pvVar18 = (void *)(ulong)uVar20;
      iVar49 = (peVar19->chunk).height;
      local_e0 = CONCAT71(local_e0._1_7_,(int)uVar20 < iVar49);
    } while ((int)uVar20 < iVar49);
  }
  return (byte)local_e0 & 1;
}

Assistant:

static exr_result_t
uncompress_b44_impl (
    exr_decode_pipeline_t* decode,
    const void*            compressed_data,
    uint64_t               comp_buf_size,
    void*                  uncompressed_data,
    uint64_t               uncomp_buf_size)
{
    const uint8_t* in      = (const uint8_t*) compressed_data;
    uint8_t*       out     = (uint8_t*) uncompressed_data;
    uint8_t*       scratch = (uint8_t*) decode->scratch_buffer_1;
    uint8_t*       tmp;
    uint16_t *     row0, *row1, *row2, *row3;
    uint64_t       n, nBytes, bpl = 0, bIn = 0;
    int            nx, ny;
    uint16_t       s[16];

    for (int c = 0; c < decode->channel_count; ++c)
    {
        const exr_coding_channel_info_t* curc = decode->channels + c;
        nx                                    = curc->width;
        ny                                    = curc->height;
        nBytes = (uint64_t) (ny) * (uint64_t) (nx) *
                 (uint64_t) (curc->bytes_per_element);

        if (nBytes == 0) continue;

        if (curc->data_type != EXR_PIXEL_HALF)
        {
            if (bIn + nBytes > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
            memcpy (scratch, in, nBytes);
            in += nBytes;
            bIn += nBytes;
            scratch += nBytes;
            continue;
        }

        for (int y = 0; y < ny; y += 4)
        {
            row0 = (uint16_t*) scratch;
            row0 += y * nx;
            row1 = row0 + nx;
            row2 = row1 + nx;
            row3 = row2 + nx;
            for (int x = 0; x < nx; x += 4)
            {
                if (bIn + 3 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

                /* check if 3-byte encoded flat field */
                if (in[2] >= (13 << 2))
                {
                    unpack3 (in, s);
                    in += 3;
                    bIn += 3;
                }
                else
                {
                    if (bIn + 14 > comp_buf_size) return EXR_ERR_OUT_OF_MEMORY;
                    unpack14 (in, s);
                    in += 14;
                    bIn += 14;
                }

                if (curc->p_linear) convertToLinear (s);

                priv_from_native16 (s, 16);

                n = (x + 3 < nx) ? 4 * sizeof (uint16_t)
                                 : (uint64_t) (nx - x) * sizeof (uint16_t);
                if (y + 3 < ny)
                {
                    memcpy (row0, &s[0], n);
                    memcpy (row1, &s[4], n);
                    memcpy (row2, &s[8], n);
                    memcpy (row3, &s[12], n);
                }
                else
                {
                    memcpy (row0, &s[0], n);
                    if (y + 1 < ny) memcpy (row1, &s[4], n);
                    if (y + 2 < ny) memcpy (row2, &s[8], n);
                }
                row0 += 4;
                row1 += 4;
                row2 += 4;
                row3 += 4;
            }
        }
        scratch += nBytes;
    }

    /* now put it back so each scanline has channel data */
    bIn = 0;
    for (int y = 0; y < decode->chunk.height; ++y)
    {
        int cury = y + decode->chunk.start_y;

        scratch = (uint8_t*) decode->scratch_buffer_1;
        for (int c = 0; c < decode->channel_count; ++c)
        {
            const exr_coding_channel_info_t* curc = decode->channels + c;

            nx     = curc->width;
            ny     = curc->height;
            bpl    = ((uint64_t) (nx)) * (uint64_t) (curc->bytes_per_element);
            nBytes = ((uint64_t) (ny)) * bpl;

            if (nBytes == 0) continue;

            tmp = scratch;
            if (curc->y_samples > 1)
            {
                if ((cury % curc->y_samples) != 0)
                {
                    scratch += nBytes;
                    continue;
                }
                tmp += ((uint64_t) (y / curc->y_samples)) * bpl;
            }
            else
                tmp += ((uint64_t) y) * bpl;

            if (bIn + bpl > uncomp_buf_size) return EXR_ERR_OUT_OF_MEMORY;

            memcpy (out, tmp, bpl);

            bIn += bpl;
            out += bpl;
            scratch += nBytes;
        }
    }

    return EXR_ERR_SUCCESS;
}